

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::X3DExporter
          (X3DExporter *this,char *pFileName,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  undefined1 local_20b;
  allocator local_20a;
  allocator local_209;
  value_type local_208;
  undefined1 local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  value_type local_1c0;
  undefined1 local_17b;
  allocator local_17a;
  allocator local_179;
  value_type local_178;
  undefined1 local_133;
  allocator local_132;
  allocator local_131;
  value_type local_130;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  ExportProperties *param_4_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFileName_local;
  X3DExporter *this_local;
  
  this->mScene = pScene;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = (size_t)param_4;
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->mDEF_Map_Mesh);
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->mDEF_Map_Material);
  std::__cxx11::string::string((string *)&this->mIndentationString);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48);
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFileName,"wt");
  this->mOutFile = (IOStream *)CONCAT44(extraout_var,iVar1);
  if (this->mOutFile == (IOStream *)0x0) {
    local_9a = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,pFileName,&local_99);
    std::operator+(&local_78,"Could not open output .x3d file: ",&local_98);
    DeadlyImportError::DeadlyImportError(this_00,&local_78);
    local_9a = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",&local_c1);
  XML_Write(this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,
             "<!DOCTYPE X3D PUBLIC \"ISO//Web3D//DTD X3D 3.3//EN\" \"http://www.web3d.org/specifications/x3d-3.3.dtd\">\n"
             ,&local_e9);
  XML_Write(this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"profile",&local_131);
  local_133 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130.Value,"Interchange",&local_132);
  local_133 = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48,&local_130);
  SAttribute::~SAttribute(&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_132);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"version",&local_179);
  local_17b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178.Value,"3.3",&local_17a);
  local_17b = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48,&local_178);
  SAttribute::~SAttribute(&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"xmlns:xsd",&local_1c1);
  local_1c3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0.Value,"http://www.w3.org/2001/XMLSchema-instance",&local_1c2);
  local_1c3 = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48,&local_1c0);
  SAttribute::~SAttribute(&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"xsd:noNamespaceSchemaLocation",&local_209);
  local_20b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208.Value,"http://www.web3d.org/specifications/x3d-3.3.xsd",&local_20a
            );
  local_20b = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48,&local_208);
  SAttribute::~SAttribute(&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_20a);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"X3D",&local_231);
  NodeHelper_OpenNode(this,&local_230,0,false,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)local_48);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"head",&local_259);
  NodeHelper_OpenNode(this,&local_258,1,false);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::operator+(&local_280,&this->mIndentationString,
                 "<!-- All \"meta\" from this section tou will found in <Scene> node as MetadataString nodes. -->\n"
                );
  XML_Write(this,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"head",&local_2a1);
  NodeHelper_CloseNode(this,&local_2a0,1);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"Scene",&local_2c9);
  NodeHelper_OpenNode(this,&local_2c8,1,false);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  Export_Node(this,this->mScene->mRootNode,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"Scene",&local_2f1);
  NodeHelper_CloseNode(this,&local_2f0,1);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"X3D",&local_319);
  NodeHelper_CloseNode(this,&local_318,0);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,this->mOutFile);
  this->mOutFile = (IOStream *)0x0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::~list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_48);
  return;
}

Assistant:

X3DExporter::X3DExporter(const char* pFileName, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
	: mScene(pScene)
{
list<SAttribute> attr_list;

	mOutFile = pIOSystem->Open(pFileName, "wt");
	if(mOutFile == nullptr) throw DeadlyExportError("Could not open output .x3d file: " + string(pFileName));

	// Begin document
	XML_Write("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
	XML_Write("<!DOCTYPE X3D PUBLIC \"ISO//Web3D//DTD X3D 3.3//EN\" \"http://www.web3d.org/specifications/x3d-3.3.dtd\">\n");
	// Root node
	attr_list.push_back({"profile", "Interchange"});
	attr_list.push_back({"version", "3.3"});
	attr_list.push_back({"xmlns:xsd", "http://www.w3.org/2001/XMLSchema-instance"});
	attr_list.push_back({"xsd:noNamespaceSchemaLocation", "http://www.web3d.org/specifications/x3d-3.3.xsd"});
	NodeHelper_OpenNode("X3D", 0, false, attr_list);
	attr_list.clear();
	// <head>: meta data.
	NodeHelper_OpenNode("head", 1);
	XML_Write(mIndentationString + "<!-- All \"meta\" from this section tou will found in <Scene> node as MetadataString nodes. -->\n");
	NodeHelper_CloseNode("head", 1);
	// Scene node.
	NodeHelper_OpenNode("Scene", 1);
	Export_Node(mScene->mRootNode, 2);
	NodeHelper_CloseNode("Scene", 1);
	// Close Root node.
	NodeHelper_CloseNode("X3D", 0);
	// Cleanup
	pIOSystem->Close(mOutFile);
	mOutFile = nullptr;
}